

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  char cVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  ImGuiTableColumn *pIVar4;
  char *pcVar5;
  bool bVar6;
  ulong local_58;
  int local_50;
  int local_4c;
  int column_n_2;
  int column_n_1;
  ImU64 expected_display_order_mask;
  ImGuiTableColumn *column;
  int column_n;
  int data_n;
  ImU64 display_order_mask;
  ImGuiTableColumnSettings *column_settings;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  ImGuiTable *table_local;
  
  pIVar2 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x10U) == 0) {
    if (table->SettingsOffset == -1) {
      column_settings = (ImGuiTableColumnSettings *)TableSettingsFindByID(table->ID);
      if ((ImGuiTableSettings *)column_settings == (ImGuiTableSettings *)0x0) {
        return;
      }
      if ((int)((ImGuiTableSettings *)column_settings)->ColumnsCount != table->ColumnsCount) {
        table->IsSettingsDirty = true;
      }
      iVar3 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr
                        (&pIVar2->SettingsTables,(ImGuiTableSettings *)column_settings);
      table->SettingsOffset = iVar3;
    }
    else {
      column_settings = (ImGuiTableColumnSettings *)TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = column_settings->UserID;
    table->RefScale = *(float *)&column_settings->Index;
    display_order_mask =
         (ImU64)ImGuiTableSettings::GetColumnSettings((ImGuiTableSettings *)column_settings);
    _column_n = 0;
    for (column._4_4_ = 0; column._4_4_ < *(char *)&column_settings[1].WidthOrWeight;
        column._4_4_ = column._4_4_ + 1) {
      cVar1 = *(char *)(display_order_mask + 8);
      iVar3 = (int)cVar1;
      if ((-1 < iVar3) && (iVar3 < table->ColumnsCount)) {
        pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar3);
        if ((column_settings->UserID & 1) != 0) {
          if ((*(byte *)(display_order_mask + 0xb) >> 3 & 1) == 0) {
            pIVar4->WidthRequest = *(float *)display_order_mask;
          }
          else {
            pIVar4->StretchWeight = *(float *)display_order_mask;
          }
          pIVar4->AutoFitQueue = '\0';
        }
        if ((column_settings->UserID & 2) == 0) {
          pIVar4->DisplayOrder = cVar1;
        }
        else {
          pIVar4->DisplayOrder = *(ImGuiTableColumnIdx *)(display_order_mask + 9);
        }
        _column_n = 1L << (pIVar4->DisplayOrder & 0x3fU) | _column_n;
        bVar6 = (*(byte *)(display_order_mask + 0xb) >> 2 & 1) != 0;
        pIVar4->IsEnabledNextFrame = bVar6;
        pIVar4->IsEnabled = bVar6;
        pIVar4->SortOrder = *(ImGuiTableColumnIdx *)(display_order_mask + 10);
        pIVar4->field_0x64 = pIVar4->field_0x64 & 0xfc | *(byte *)(display_order_mask + 0xb) & 3;
      }
      display_order_mask = display_order_mask + 0xc;
    }
    if (*(char *)&column_settings[1].WidthOrWeight == '@') {
      local_58 = 0xffffffffffffffff;
    }
    else {
      local_58 = (1L << (*(byte *)&column_settings[1].WidthOrWeight & 0x3f)) - 1;
    }
    if (_column_n != local_58) {
      for (local_4c = 0; local_4c < table->ColumnsCount; local_4c = local_4c + 1) {
        pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,local_4c);
        pIVar4->DisplayOrder = (ImGuiTableColumnIdx)local_4c;
      }
    }
    for (local_50 = 0; local_50 < table->ColumnsCount; local_50 = local_50 + 1) {
      pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,local_50);
      pcVar5 = ImSpan<signed_char>::operator[]
                         (&table->DisplayOrderToIndex,(int)pIVar4->DisplayOrder);
      *pcVar5 = (char)local_50;
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        if (settings->ColumnsCount != table->ColumnsCount) // Allow settings if columns count changed. We could otherwise decide to return...
            table->IsSettingsDirty = true;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }

    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    ImU64 display_order_mask = 0;
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->StretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImGuiTableColumnIdx)column_n;
        display_order_mask |= (ImU64)1 << column->DisplayOrder;
        column->IsEnabled = column->IsEnabledNextFrame = column_settings->IsEnabled;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // Validate and fix invalid display order data
    const ImU64 expected_display_order_mask = (settings->ColumnsCount == 64) ? ~0 : ((ImU64)1 << settings->ColumnsCount) - 1;
    if (display_order_mask != expected_display_order_mask)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            table->Columns[column_n].DisplayOrder = (ImGuiTableColumnIdx)column_n;

    // Rebuild index
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
}